

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmap.c
# Opt level: O3

void cmap_init_default(void)

{
  long lVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  
  uVar2 = '\0';
  uVar3 = '\x01';
  uVar4 = '\x02';
  uVar5 = '\x03';
  uVar6 = '\x04';
  uVar7 = '\x05';
  uVar8 = '\x06';
  uVar9 = '\a';
  uVar10 = '\b';
  uVar11 = '\t';
  uVar12 = '\n';
  uVar13 = '\v';
  uVar14 = '\f';
  uVar15 = '\r';
  uVar16 = '\x0e';
  uVar17 = '\x0f';
  lVar1 = 0;
  do {
    G_cmap_input[lVar1] = uVar2;
    G_cmap_input[lVar1 + 1] = uVar3;
    G_cmap_input[lVar1 + 2] = uVar4;
    G_cmap_input[lVar1 + 3] = uVar5;
    G_cmap_input[lVar1 + 4] = uVar6;
    G_cmap_input[lVar1 + 5] = uVar7;
    G_cmap_input[lVar1 + 6] = uVar8;
    G_cmap_input[lVar1 + 7] = uVar9;
    G_cmap_input[lVar1 + 8] = uVar10;
    G_cmap_input[lVar1 + 9] = uVar11;
    G_cmap_input[lVar1 + 10] = uVar12;
    G_cmap_input[lVar1 + 0xb] = uVar13;
    G_cmap_input[lVar1 + 0xc] = uVar14;
    G_cmap_input[lVar1 + 0xd] = uVar15;
    G_cmap_input[lVar1 + 0xe] = uVar16;
    G_cmap_input[lVar1 + 0xf] = uVar17;
    lVar1 = lVar1 + 0x10;
    uVar2 = uVar2 + '\x10';
    uVar3 = uVar3 + '\x10';
    uVar4 = uVar4 + '\x10';
    uVar5 = uVar5 + '\x10';
    uVar6 = uVar6 + '\x10';
    uVar7 = uVar7 + '\x10';
    uVar8 = uVar8 + '\x10';
    uVar9 = uVar9 + '\x10';
    uVar10 = uVar10 + '\x10';
    uVar11 = uVar11 + '\x10';
    uVar12 = uVar12 + '\x10';
    uVar13 = uVar13 + '\x10';
    uVar14 = uVar14 + '\x10';
    uVar15 = uVar15 + '\x10';
    uVar16 = uVar16 + '\x10';
    uVar17 = uVar17 + '\x10';
  } while (lVar1 != 0x100);
  uVar2 = '\0';
  uVar3 = '\x01';
  uVar4 = '\x02';
  uVar5 = '\x03';
  uVar6 = '\x04';
  uVar7 = '\x05';
  uVar8 = '\x06';
  uVar9 = '\a';
  uVar10 = '\b';
  uVar11 = '\t';
  uVar12 = '\n';
  uVar13 = '\v';
  uVar14 = '\f';
  uVar15 = '\r';
  uVar16 = '\x0e';
  uVar17 = '\x0f';
  lVar1 = 0;
  do {
    G_cmap_output[lVar1] = uVar2;
    G_cmap_output[lVar1 + 1] = uVar3;
    G_cmap_output[lVar1 + 2] = uVar4;
    G_cmap_output[lVar1 + 3] = uVar5;
    G_cmap_output[lVar1 + 4] = uVar6;
    G_cmap_output[lVar1 + 5] = uVar7;
    G_cmap_output[lVar1 + 6] = uVar8;
    G_cmap_output[lVar1 + 7] = uVar9;
    G_cmap_output[lVar1 + 8] = uVar10;
    G_cmap_output[lVar1 + 9] = uVar11;
    G_cmap_output[lVar1 + 10] = uVar12;
    G_cmap_output[lVar1 + 0xb] = uVar13;
    G_cmap_output[lVar1 + 0xc] = uVar14;
    G_cmap_output[lVar1 + 0xd] = uVar15;
    G_cmap_output[lVar1 + 0xe] = uVar16;
    G_cmap_output[lVar1 + 0xf] = uVar17;
    lVar1 = lVar1 + 0x10;
    uVar2 = uVar2 + '\x10';
    uVar3 = uVar3 + '\x10';
    uVar4 = uVar4 + '\x10';
    uVar5 = uVar5 + '\x10';
    uVar6 = uVar6 + '\x10';
    uVar7 = uVar7 + '\x10';
    uVar8 = uVar8 + '\x10';
    uVar9 = uVar9 + '\x10';
    uVar10 = uVar10 + '\x10';
    uVar11 = uVar11 + '\x10';
    uVar12 = uVar12 + '\x10';
    uVar13 = uVar13 + '\x10';
    uVar14 = uVar14 + '\x10';
    uVar15 = uVar15 + '\x10';
    uVar16 = uVar16 + '\x10';
    uVar17 = uVar17 + '\x10';
  } while (lVar1 != 0x100);
  G_cmap_id[4] = '\0';
  G_cmap_id[0] = '\0';
  G_cmap_id[1] = '\0';
  G_cmap_id[2] = '\0';
  G_cmap_id[3] = '\0';
  builtin_strncpy(G_cmap_ldesc,"(native/no mapping)",0x14);
  S_cmap_loaded = 0;
  return;
}

Assistant:

void cmap_init_default(void)
{
    size_t i;

    /* initialize the input table */
    for (i = 0 ; i < sizeof(G_cmap_input)/sizeof(G_cmap_input[0]) ; ++i)
        G_cmap_input[i] = (unsigned char)i;

    /* initialize the output table */
    for (i = 0 ; i < sizeof(G_cmap_output)/sizeof(G_cmap_output[0]) ; ++i)
        G_cmap_output[i] = (unsigned char)i;

    /* we have a null ID */
    memset(G_cmap_id, 0, sizeof(G_cmap_id));

    /* indicate that it's the default */
    strcpy(G_cmap_ldesc, "(native/no mapping)");

    /* note that we have no character set loaded */
    S_cmap_loaded = FALSE;
}